

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O1

void __thiscall
Am_Drawonable_Impl::adjust_gcvalues_color_drawfn
          (Am_Drawonable_Impl *this,XGCValues *values,unsigned_long *mask,unsigned_long fore_index,
          Am_Draw_Function f)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  int iVar3;
  unsigned_long uVar4;
  
  uVar4 = fore_index;
  switch(f) {
  case Am_DRAW_COPY:
  case Am_DRAW_MASK_COPY:
    if (values->function != 3) {
      *(byte *)mask = (byte)*mask | 1;
      values->function = 3;
    }
    break;
  case Am_DRAW_OR:
    if (this->screen->whitepixel == 0) {
      iVar3 = 7;
      if (values->function != 7) goto LAB_002752bd;
    }
    else {
      iVar3 = 1;
      if (values->function != 1) {
LAB_002752bd:
        *(byte *)mask = (byte)*mask | 1;
        values->function = iVar3;
      }
    }
    break;
  case Am_DRAW_XOR:
    if (values->function != 6) {
      *(byte *)mask = (byte)*mask | 1;
      values->function = 6;
    }
    uVar1 = this->screen->whitepixel;
    if (((uVar1 != 0) && (uVar2 = this->screen->blackpixel, uVar4 = uVar1, uVar2 != fore_index)) &&
       (uVar4 = fore_index, uVar1 == fore_index)) {
      uVar4 = uVar2;
    }
    break;
  case Am_DRAW_GRAPHIC_OR:
    if (values->function != 7) {
      *(byte *)mask = (byte)*mask | 1;
      values->function = 7;
    }
    break;
  case Am_DRAW_GRAPHIC_XOR:
    if (values->function != 6) {
      *(byte *)mask = (byte)*mask | 1;
      values->function = 6;
    }
    break;
  case Am_DRAW_GRAPHIC_AND:
    if (values->function != 1) {
      *(byte *)mask = (byte)*mask | 1;
      values->function = 1;
    }
    break;
  case Am_DRAW_GRAPHIC_NIMP:
    if (values->function != 4) {
      *(byte *)mask = (byte)*mask | 1;
      values->function = 4;
    }
    break;
  default:
    goto switchD_00275211_default;
  }
  if (values->foreground != uVar4) {
    values->foreground = uVar4;
    *(byte *)mask = (byte)*mask | 4;
  }
switchD_00275211_default:
  return;
}

Assistant:

void
Am_Drawonable_Impl::adjust_gcvalues_color_drawfn(XGCValues &values,
                                                 unsigned long &mask,
                                                 unsigned long fore_index,
                                                 Am_Draw_Function f) const
{
  switch (f) {
  case Am_DRAW_COPY:
  case Am_DRAW_MASK_COPY:
    if (values.function != GXcopy) {
      mask |= GCFunction;
      values.function = GXcopy;
    }
    adjust_gcvalues_color(values, mask, fore_index);
    break;
  case Am_DRAW_OR:
    if (screen->whitepixel) {
      // HP-type display, where white == 1
      if (values.function != GXand) {
        mask |= GCFunction;
        values.function = GXand;
      }
      // non-HP-type display, white == 0
    } else if (values.function != GXor) {
      mask |= GCFunction;
      values.function = GXor;
    }
    adjust_gcvalues_color(values, mask, fore_index);
    break;
  case Am_DRAW_XOR:
    if (values.function != GXxor) {
      mask |= GCFunction;
      values.function = GXxor;
    }
    adjust_gcvalues_color_xor(values, mask, fore_index);
    break;
  case Am_DRAW_GRAPHIC_OR:
    if (values.function != GXor) {
      mask |= GCFunction;
      values.function = GXor;
    }
    adjust_gcvalues_color(values, mask, fore_index);
    break;
  case Am_DRAW_GRAPHIC_XOR:
    if (values.function != GXxor) {
      mask |= GCFunction;
      values.function = GXxor;
    }
    adjust_gcvalues_color(values, mask, fore_index);
    break;
  case Am_DRAW_GRAPHIC_AND:
    if (values.function != GXand) {
      mask |= GCFunction;
      values.function = GXand;
    }
    adjust_gcvalues_color(values, mask, fore_index);
    break;
  case Am_DRAW_GRAPHIC_NIMP:
    if (values.function != GXandInverted) {
      mask |= GCFunction;
      values.function = GXandInverted;
    }
    adjust_gcvalues_color(values, mask, fore_index);
    break;
  }
}